

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

RectangleNode * rengine::RectangleNode::create(void)

{
  bool bVar1;
  RectangleNode *t;
  Node *local_10;
  
  bVar1 = AllocationPool<rengine::RectangleNode>::isExhausted
                    (&__allocation_pool_rengine_RectangleNode);
  if (bVar1) {
    local_10 = (Node *)operator_new(0x58);
    RectangleNode((RectangleNode *)local_10,RectangleNodeType);
  }
  else {
    local_10 = (Node *)AllocationPool<rengine::RectangleNode>::allocate
                                 (&__allocation_pool_rengine_RectangleNode);
    Node::__mark_as_pool_allocated(local_10);
  }
  return (RectangleNode *)local_10;
}

Assistant:

static RectangleNode *create(rect2d geometry, vec4 color = vec4()) {
        auto node = create();
        node->setGeometry(geometry);
        node->setColor(color);
        return node;
    }